

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsFederatePublishJSON(HelicsFederate fed,char *json,HelicsError *err)

{
  bool bVar1;
  element_type *this;
  long in_RSI;
  string *in_stack_00000058;
  shared_ptr<helics::ValueFederate> fedObj;
  HelicsError *in_stack_ffffffffffffff90;
  HelicsFederate in_stack_ffffffffffffff98;
  allocator<char> local_51;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  __shared_ptr local_28 [40];
  
  if (in_RSI != 0) {
    getValueFedSharedPtr(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
    if (bVar1) {
      this = std::
             __shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cd4d2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      helics::ValueFederate::publishJSON
                (fedObj.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,in_stack_00000058);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::allocator<char>::~allocator(&local_51);
    }
    std::shared_ptr<helics::ValueFederate>::~shared_ptr
              ((shared_ptr<helics::ValueFederate> *)0x1cd58e);
  }
  return;
}

Assistant:

void helicsFederatePublishJSON(HelicsFederate fed, const char* json, HelicsError* err)
{
    if (json == nullptr) {  // this isn't an error just doesn't do anything
        return;
    }
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return;
    }
    try {
        fedObj->publishJSON(json);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}